

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
SetProperty_JavascriptString
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          JavascriptString *instance,Var propertyNameString,Var value,PropertyOperationFlags flags,
          PropertyRecord *info)

{
  JavascriptString *instance_00;
  PropertyId propertyId;
  BOOL BVar1;
  ScriptContext *this_00;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  propertyRecord = info;
  info_local._4_4_ = flags;
  pvStack_30 = value;
  value_local = propertyNameString;
  propertyNameString_local = instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  ScriptContext::GetOrAddPropertyRecord(this_00,(JavascriptString *)value_local,&local_48);
  instance_00 = propertyNameString_local;
  propertyId = PropertyRecord::GetPropertyId(local_48);
  BVar1 = SetProperty(this,(DynamicObject *)instance_00,propertyId,pvStack_30,info_local._4_4_,
                      (PropertyValueInfo *)propertyRecord);
  return BVar1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty_JavascriptString(DynamicObject* instance, JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info, TemplateParameter::Box<const PropertyRecord*>)
    {
        // Either the property exists in the dictionary, in which case a PropertyRecord for it exists,
        // or we have to add it to the dictionary, in which case we need to get or create a PropertyRecord.
        // Thus, just get or create one and call the PropertyId overload of SetProperty.
        PropertyRecord const * propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty(instance, propertyRecord->GetPropertyId(), value, flags, info);
    }